

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeQueue.h
# Opt level: O2

void __thiscall
NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
::Push(NodeQueue<neatlib::LockFreeHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_4UL,_8UL>::DataNode>
       *this,DataNode *node)

{
  DataNode *pDVar1;
  
  pDVar1 = this->head_;
  node->next = pDVar1;
  node->last = (DataNode *)0x0;
  if (pDVar1 == (DataNode *)0x0) {
    this->tail_ = node;
    node->next = (DataNode *)0x0;
  }
  else {
    pDVar1->last = node;
  }
  this->head_ = node;
  return;
}

Assistant:

void Push(NODE *node) {
        node->next = head_;
        node->last = nullptr;
        if (!Empty())
            head_->last = node;
        else {
            tail_ = node;
            tail_->next = nullptr;
        }
        head_ = node;
    }